

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O1

semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,int,std::less<void>>
          (semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,undefined8 *first,int param_4)

{
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined8 local_28;
  undefined8 local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  undefined8 local_10;
  
  if (0 < param_4) {
    local_20 = *(undefined8 *)this;
    local_18 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)this = 0;
    local_10 = *(undefined8 *)(this + 0x10);
    local_38 = *first;
    local_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)first[1];
    first[1] = 0;
    *first = 0;
    local_28 = first[2];
    semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
    ::semiintersect_iterator(__return_storage_ptr__,&local_20,&local_38,param_4);
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("min_items > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                ,0x177,
                "auto burst::make_semiintersect_iterator(RandomAccessIterator, RandomAccessIterator, Integral, Compare) [RandomAccessIterator = burst::owning_iterator<std::vector<boost::iterator_range<const int *>>>, Integral = int, Compare = std::less<void>]"
               );
}

Assistant:

auto
        make_semiintersect_iterator
        (
            RandomAccessIterator first, RandomAccessIterator last,
            Integral min_items,
            Compare compare
        )
    {
        assert(min_items > 0);
        return
            semiintersect_iterator<RandomAccessIterator, Compare>
            (
                std::move(first), std::move(last),
                static_cast<std::size_t>(min_items),
                compare
            );
    }